

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O2

void __thiscall llbuild::buildsystem::BuildKey::BuildKey(BuildKey *this,char kindCode,StringRef str)

{
  string encodedKey;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  string local_48 [32];
  
  (this->key).key._M_dataplus._M_p = (pointer)&(this->key).key.field_2;
  (this->key).key._M_string_length = 0;
  (this->key).key.field_2._M_local_buf[0] = '\0';
  local_68 = local_58;
  local_60 = 0;
  local_58[0] = 0;
  std::__cxx11::string::reserve((ulong)&local_68);
  std::__cxx11::string::push_back((char)&local_68);
  std::__cxx11::string::append<char_const*,void>((string *)&local_68,str.Data,str.Data + str.Length)
  ;
  std::__cxx11::string::string(local_48,(string *)&local_68);
  std::__cxx11::string::operator=((string *)this,local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

BuildKey(char kindCode, StringRef str) {
    std::string encodedKey;
    encodedKey.reserve(1 + str.size());
    encodedKey.push_back(kindCode);
    encodedKey.append(str.begin(), str.end());
    key = encodedKey;
  }